

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel1DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,float coordX,int coordY,IVec4 *result)

{
  int iVar1;
  int ndx;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  int c;
  float fVar9;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vector<int,_4> res;
  Vector<int,_4> color;
  Vec2 uBounds;
  byte local_64 [12];
  uint local_58 [4];
  tcu local_48 [16];
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coordX,*(int *)prec,*(int *)(prec + 0xc));
  fVar9 = floorf(local_38);
  c = (int)fVar9;
  fVar9 = floorf(local_34);
  iVar2 = (int)fVar9;
  bVar8 = c <= iVar2;
  if (c <= iVar2) {
    bVar8 = true;
    do {
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
      if ((((iVar3 < 0) || ((access->m_size).m_data[0] <= iVar3)) || (coordY < 0)) ||
         (((access->m_size).m_data[1] <= coordY || ((access->m_size).m_data[2] < 1)))) {
        sampleTextureBorder<int>(local_48,&access->m_format,sampler);
      }
      else {
        ConstPixelBufferAccess::getPixelT<int>
                  ((ConstPixelBufferAccess *)local_48,(int)access,iVar3,coordY);
      }
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      lVar4 = 0;
      do {
        iVar3 = *(int *)(local_48 + lVar4 * 4);
        iVar1 = result->m_data[lVar4];
        uVar6 = iVar3 - iVar1;
        if (iVar3 - iVar1 == 0 || iVar3 < iVar1) {
          uVar6 = -(iVar3 - iVar1);
        }
        local_58[lVar4] = uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[8] = 0;
      local_64[9] = 0;
      local_64[10] = 0;
      local_64[0xb] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4 + 8] = local_58[lVar4] <= *(uint *)(prec + lVar4 * 4 + 0x18);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[4] = 0;
      local_64[5] = 0;
      local_64[6] = 0;
      local_64[7] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4 + 4] = (byte)prec[lVar4 + 0x28] ^ 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[0] = 0;
      local_64[1] = 0;
      local_64[2] = 0;
      local_64[3] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4] = local_64[lVar4 + 4] | local_64[lVar4 + 8];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (local_64[0] != 0) {
        uVar5 = 0xffffffffffffffff;
        do {
          if (uVar5 == 2) {
            uVar7 = 3;
            break;
          }
          uVar7 = uVar5 + 1;
          lVar4 = uVar5 + 2;
          uVar5 = uVar7;
        } while (local_64[lVar4] != 0);
        if (2 < uVar7) {
          return bVar8;
        }
      }
      c = c + 1;
      bVar8 = c <= iVar2;
    } while (c <= iVar2);
  }
  return bVar8;
}

Assistant:

bool isLevel1DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const float					coordX,
								 const int						coordY,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coordX, coordY, result);
}